

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_file_name_posix.cpp
# Opt level: O2

string * pstore::process_file_name_abi_cxx11_(void)

{
  errno_erc erc;
  __pid_t _Var1;
  ostream *poVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  string *in_RDI;
  ulong new_elements;
  span<char,__1L> sVar6;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  ostringstream str;
  small_vector<char,_256UL> buffer;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  poVar2 = std::operator<<((ostream *)&str,"/proc/");
  _Var1 = getpid();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,_Var1);
  std::operator<<(poVar2,"/exe");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  memset(&buffer,0,0x120);
  new_elements = 0x100;
  buffer.buffer_ = buffer.small_buffer_._M_elems;
  do {
    while( true ) {
      small_vector<char,_256UL>::resize(&buffer,new_elements);
      sVar6 = gsl::make_span<pstore::small_vector<char,256ul>>(&buffer);
      if (sVar6.storage_.super_extent_type<_1L>.size_.size_ < 0) {
        assert_failed("buffer_size >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/os/process_file_name_posix.cpp"
                      ,0x75);
      }
      uVar3 = readlink(path._M_dataplus._M_p,sVar6.storage_.data_,
                       sVar6.storage_.super_extent_type<_1L>.size_.size_);
      if ((long)uVar3 < 0) {
        piVar4 = __errno_location();
        erc.err_ = *piVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
        poVar2 = std::operator<<((ostream *)&str,"readlink() of \"");
        poVar2 = std::operator<<(poVar2,(string *)&path);
        std::operator<<(poVar2,"\" failed");
        std::__cxx11::stringbuf::str();
        raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_2e8);
      }
      uVar5 = (new_elements >> 1) + new_elements;
      new_elements = uVar5;
      if (uVar5 < uVar3) {
        new_elements = uVar3;
      }
      if (uVar3 != 0) break;
      if (0xffffff < uVar5) goto LAB_0012ddd8;
    }
  } while ((new_elements < 0x1000000) && (buffer.elements_ <= uVar3));
  if (new_elements < 0x1000000) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buffer.big_buffer_.super__Vector_base<char,_std::allocator<char>_>);
    std::__cxx11::string::~string((string *)&path);
    return in_RDI;
  }
LAB_0012ddd8:
  raise<pstore::error_code>(unknown_process_path);
}

Assistant:

std::string process_file_name () {
        std::string const path = link_path ();
        auto read_link = [&path] (gsl::span<char> const buffer) {
            auto const buffer_size = buffer.size ();
            PSTORE_ASSERT (buffer_size >= 0);
            ssize_t const num_chars = ::readlink (path.c_str (), buffer.data (),
                                                  clamp (static_cast<std::size_t> (buffer_size),
                                                         std::size_t{0}, std::size_t{SSIZE_MAX}));
            if (num_chars < 0) {
                int const error = errno;
                std::ostringstream str;
                str << "readlink() of \"" << path << "\" failed";
                raise (errno_erc{error}, str.str ());
            }
            PSTORE_STATIC_ASSERT (std::numeric_limits<std::size_t>::max () >=
                                  unsigned_cast (std::numeric_limits<ssize_t>::max ()));
            return static_cast<std::size_t> (num_chars);
        };

        small_vector<char> buffer;
        std::size_t const length = process_file_name (read_link, buffer);
        return {buffer.data (), length};
    }